

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayImpDirWrapper.cpp
# Opt level: O0

uint64_t __thiscall DelayImpFuncWrapper::getOrdinal(DelayImpFuncWrapper *this)

{
  uint64_t uVar1;
  size_t sVar2;
  byte bVar3;
  uint64_t shiftedVal;
  size_t shiftSize;
  size_t fieldSize;
  uint64_t addr;
  DelayImpFuncWrapper *pDStack_18;
  bool isOk;
  DelayImpFuncWrapper *this_local;
  
  addr._7_1_ = 0;
  pDStack_18 = this;
  uVar1 = ExeElementWrapper::getNumValue((ExeElementWrapper *)this,0,(bool *)((long)&addr + 7));
  if (((addr._7_1_ & 1) == 0) || (uVar1 == 0xffffffffffffffff)) {
    this_local = (DelayImpFuncWrapper *)0xffffffffffffffff;
  }
  else {
    sVar2 = ptrLen(this);
    bVar3 = (char)sVar2 * -8 + 9;
    this_local = (DelayImpFuncWrapper *)((uVar1 << (bVar3 & 0x3f)) >> (bVar3 & 0x3f));
  }
  return (uint64_t)this_local;
}

Assistant:

uint64_t DelayImpFuncWrapper::getOrdinal()
{
    bool isOk = false;
    uint64_t addr = this->getNumValue(NAMETHUNK_ADDR, &isOk);
    if (!isOk || addr == INVALID_ADDR) return INVALID_ADDR;

    size_t fieldSize = this->ptrLen() * 8; // in bits!
    size_t shiftSize = (sizeof(addr) - fieldSize) + 1;

    uint64_t shiftedVal = (addr << shiftSize) >> shiftSize;
    return shiftedVal;
}